

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_68;
  char local_58 [40];
  
  local_68._M_stream = it->_M_stream;
  local_68._M_string = it->_M_string;
  uVar4 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar13 = (long)iVar1;
  pcVar3 = local_58 + lVar13;
  if (uVar4 < 100) {
    bVar14 = false;
  }
  else {
    iVar8 = -1;
    uVar10 = 1;
    iVar11 = -2;
    uVar12 = 2;
    uVar7 = uVar4;
    do {
      uVar4 = uVar7 / 100;
      uVar2 = (ulong)(uint)(((int)uVar7 + (int)uVar4 * -100) * 2);
      pcVar3[-1] = internal::basic_data<void>::DIGITS[uVar2 + 1];
      lVar5 = -1;
      if ((int)(uVar10 / 3) * 3 + iVar8 == 0) {
        *(num_writer *)(pcVar3 + -2) = this[0xc];
        lVar5 = -2;
      }
      pcVar3[lVar5 + -1] = internal::basic_data<void>::DIGITS[uVar2];
      if ((int)(uVar12 / 3) * 3 + iVar11 == 0) {
        *(num_writer *)(pcVar3 + lVar5 + -2) = this[0xc];
        lVar5 = lVar5 + -2;
      }
      else {
        lVar5 = lVar5 + -1;
      }
      pcVar3 = pcVar3 + lVar5;
      iVar8 = iVar8 + -2;
      uVar9 = (int)uVar10 + 2;
      uVar10 = (ulong)uVar9;
      iVar11 = iVar11 + -2;
      uVar12 = (ulong)((int)uVar12 + 2);
      bVar14 = 9999 < uVar7;
      uVar7 = uVar4;
    } while (bVar14);
    bVar14 = iVar8 + (uVar9 / 3) * 3 == 0;
  }
  if (uVar4 < 10) {
    bVar6 = (byte)uVar4 | 0x30;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[(uVar4 * 2 & 0xffffffff) + 1];
    lVar5 = -1;
    if (bVar14) {
      *(num_writer *)(pcVar3 + -2) = this[0xc];
      lVar5 = -2;
    }
    pcVar3 = pcVar3 + lVar5;
    bVar6 = internal::basic_data<void>::DIGITS[uVar4 * 2 & 0x1fffffffe];
  }
  pcVar3[-1] = bVar6;
  if (0 < iVar1) {
    pcVar3 = local_58;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_68,pcVar3);
      pcVar3 = pcVar3 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  it->_M_stream = local_68._M_stream;
  it->_M_string = local_68._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }